

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O1

void luaJIT_profile_start(lua_State *L,char *mode,luaJIT_profile_callback cb,void *data)

{
  char cVar1;
  uint32_t uVar2;
  
  cVar1 = *mode;
  if (cVar1 == '\0') {
    uVar2 = 10;
  }
  else {
    uVar2 = 10;
    do {
      mode = mode + 1;
      if ((cVar1 == 'f') || (cVar1 == 'l')) {
        *(int *)((ulong)(L->glref).ptr32 + 0xc64) = (int)cVar1;
        lj_trace_flushall(L);
      }
      else if (cVar1 == 'i') {
        cVar1 = *mode;
        uVar2 = 0;
        if ((byte)(cVar1 - 0x30U) < 10) {
          uVar2 = 0;
          do {
            uVar2 = (uint)(byte)(cVar1 - 0x30) + uVar2 * 10;
            cVar1 = mode[1];
            mode = mode + 1;
          } while ((byte)(cVar1 - 0x30U) < 10);
        }
        if ((int)uVar2 < 2) {
          uVar2 = 1;
        }
      }
      cVar1 = *mode;
    } while (cVar1 != '\0');
  }
  if ((profile_state.g != (global_State *)0x0) &&
     (luaJIT_profile_stop(L), profile_state.g != (global_State *)0x0)) {
    return;
  }
  profile_state.g = (global_State *)(ulong)(L->glref).ptr32;
  profile_state.samples = 0;
  profile_state.sb.L.ptr32 = (uint32_t)L;
  profile_state.sb.p.ptr32 = 0;
  profile_state.sb.e.ptr32 = 0;
  profile_state.sb.b.ptr32 = 0;
  profile_state.timer.opt.handler = profile_handler;
  profile_state.cb = cb;
  profile_state.data = data;
  profile_state.timer.opt.interval_msec = uVar2;
  lj_profile_timer_start(&profile_state.timer);
  return;
}

Assistant:

LUA_API void luaJIT_profile_start(lua_State *L, const char *mode,
				  luaJIT_profile_callback cb, void *data)
{
  ProfileState *ps = &profile_state;
  int interval = LJ_PROFILE_INTERVAL_DEFAULT;
  while (*mode) {
    int m = *mode++;
    switch (m) {
    case 'i':
      interval = 0;
      while (*mode >= '0' && *mode <= '9')
	interval = interval * 10 + (*mode++ - '0');
      if (interval <= 0) interval = 1;
      break;
#if LJ_HASJIT
    case 'l': case 'f':
      L2J(L)->prof_mode = m;
      lj_trace_flushall(L);
      break;
#endif
    default:  /* Ignore unknown mode chars. */
      break;
    }
  }
  if (ps->g) {
    luaJIT_profile_stop(L);
    if (ps->g) return;  /* Profiler in use by another VM. */
  }
  ps->g = G(L);
  ps->cb = cb;
  ps->data = data;
  ps->samples = 0;
  lj_buf_init(L, &ps->sb);
  ps->timer.opt.interval_msec = interval;
  ps->timer.opt.handler = profile_handler;
  lj_profile_timer_start(&ps->timer);
}